

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

int Gia_ObjWhatFanin(Gia_Man_t *p,Gia_Obj_t *pObj,Gia_Obj_t *pFanin)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pFanin_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  pGVar1 = Gia_ObjFanin0(pObj);
  if (pGVar1 == pFanin) {
    p_local._4_4_ = 0;
  }
  else {
    pGVar1 = Gia_ObjFanin1(pObj);
    if (pGVar1 == pFanin) {
      p_local._4_4_ = 1;
    }
    else {
      pGVar1 = Gia_ObjFanin2(p,pObj);
      if (pGVar1 != pFanin) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ed,"int Gia_ObjWhatFanin(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
      }
      p_local._4_4_ = 2;
    }
  }
  return p_local._4_4_;
}

Assistant:

static inline int          Gia_ObjWhatFanin( Gia_Man_t * p, Gia_Obj_t * pObj, Gia_Obj_t * pFanin )  { if ( Gia_ObjFanin0(pObj) == pFanin ) return 0; if ( Gia_ObjFanin1(pObj) == pFanin ) return 1; if ( Gia_ObjFanin2(p, pObj) == pFanin ) return 2; assert(0); return -1; }